

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

ON_SubDVertex * __thiscall
ON_SubD_FixedSizeHeap::AllocateVertex
          (ON_SubD_FixedSizeHeap *this,ON_SubDVertex *vertex0,uint edge_capacity)

{
  bool bVar1;
  uint uVar2;
  ON_SubDVertex *this_00;
  long lVar3;
  ON_SubDSectorSurfacePoint *pOVar4;
  double *pdVar5;
  byte bVar6;
  double dVar7;
  ON_SubDSectorSurfacePoint in_stack_fffffffffffffee8;
  double subdP [3];
  ON_SubDSectorSurfacePoint limit_point;
  
  bVar6 = 0;
  if (((vertex0 == (ON_SubDVertex *)0x0) ||
      (bVar1 = ON_SubDVertex::GetSubdivisionPoint(vertex0,subdP), !bVar1)) ||
     (this_00 = AllocateVertex(this,subdP,edge_capacity), this_00 == (ON_SubDVertex *)0x0)) {
    ON_SubDIncrementErrorCount();
    return (ON_SubDVertex *)0x0;
  }
  uVar2 = ON_SubDComponentBase::SubdivisionLevel(&vertex0->super_ON_SubDComponentBase);
  ON_SubDComponentBase::SetSubdivisionLevel(&this_00->super_ON_SubDComponentBase,uVar2 + 1);
  this_00->m_vertex_tag = vertex0->m_vertex_tag;
  dVar7 = ON_SubDVertex::Internal_InteriorCreaseVertexSharpnessForExperts(vertex0);
  if (1.0 < dVar7) {
    dVar7 = ON_SubDEdgeSharpness::Sanitize(dVar7 + -1.0);
    ON_SubDVertex::Internal_SetInteriorCreaseVertexSharpnessForExperts(this_00,dVar7,true);
  }
  bVar1 = ON_SubDVertex::SurfacePointIsSet(vertex0);
  if (!bVar1) {
    return this_00;
  }
  bVar1 = ON_SubDVertex::GetSurfacePoint(vertex0,*vertex0->m_faces,&limit_point);
  if (!bVar1) {
    return this_00;
  }
  if (limit_point.m_sector_face != (ON_SubDFace *)0x0) {
    return this_00;
  }
  limit_point.m_next_sector_limit_point = (ON_SubDSectorSurfacePoint *)0x1;
  pOVar4 = &limit_point;
  pdVar5 = (double *)&stack0xfffffffffffffee8;
  for (lVar3 = 0xe; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pdVar5 = pOVar4->m_limitP[0];
    pOVar4 = (ON_SubDSectorSurfacePoint *)((long)pOVar4 + (ulong)bVar6 * -0x10 + 8);
    pdVar5 = pdVar5 + (ulong)bVar6 * -2 + 1;
  }
  ON_SubDVertex::SetSavedSurfacePoint(this_00,true,in_stack_fffffffffffffee8);
  return this_00;
}

Assistant:

ON_SubDVertex* ON_SubD_FixedSizeHeap::AllocateVertex(
  const ON_SubDVertex* vertex0,
  unsigned int edge_capacity
  )
{
  if ( nullptr == vertex0)
    return ON_SUBD_RETURN_ERROR(nullptr);

  double subdP[3];
  if (false == vertex0->GetSubdivisionPoint(subdP))
    return ON_SUBD_RETURN_ERROR(nullptr);
  ON_SubDVertex* v1 = AllocateVertex(subdP, edge_capacity);

  if (nullptr == v1)
    return ON_SUBD_RETURN_ERROR(nullptr);

  v1->SetSubdivisionLevel( vertex0->SubdivisionLevel() + 1 );

  v1->m_vertex_tag = vertex0->m_vertex_tag;

  const double crease_sector_vertex_sharpness0 = vertex0->Internal_InteriorCreaseVertexSharpnessForExperts();
  if (crease_sector_vertex_sharpness0 > 1.0)
  {
    // subdivide this value
    const double crease_sector_vertex_sharpness1 = ON_SubDEdgeSharpness::Sanitize(crease_sector_vertex_sharpness0 - 1.0);
    // The 2nd parameter is true because we have not attached the edges and faces yet.
    v1->Internal_SetInteriorCreaseVertexSharpnessForExperts(crease_sector_vertex_sharpness1, true);
  }

  if (vertex0->SurfacePointIsSet())
  {
    // copy any cached limit point from vertex0 to v1.
    ON_SubDSectorSurfacePoint limit_point;
    if (vertex0->GetSurfacePoint(vertex0->m_faces[0], limit_point))
    {
      if (nullptr == limit_point.m_sector_face)
      {
        limit_point.m_next_sector_limit_point = (const ON_SubDSectorSurfacePoint*)1;
        v1->SetSavedSurfacePoint(true, limit_point);
      }
    }
  }

  return v1;
}